

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<TPZEqnArray<float>,_10> * __thiscall
TPZManVector<TPZEqnArray<float>,_10>::operator=
          (TPZManVector<TPZEqnArray<float>,_10> *this,TPZManVector<TPZEqnArray<float>,_10> *copy)

{
  undefined1 auVar1 [16];
  ulong *puVar2;
  TPZEqnArray<float> *pTVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  
  if (this != copy) {
    uVar7 = (copy->super_TPZVec<TPZEqnArray<float>_>).fNElements;
    lVar6 = (this->super_TPZVec<TPZEqnArray<float>_>).fNAlloc;
    if ((lVar6 < (long)uVar7) &&
       (pTVar3 = (this->super_TPZVec<TPZEqnArray<float>_>).fStore,
       pTVar3 != (TPZEqnArray<float> *)&this->field_0x20 && pTVar3 != (TPZEqnArray<float> *)0x0)) {
      lVar6 = *(long *)&pTVar3[-1].fLastTerm;
      if (lVar6 != 0) {
        lVar4 = lVar6 * 0x22f0;
        do {
          TPZEqnArray<float>::~TPZEqnArray
                    ((TPZEqnArray<float> *)
                     ((long)pTVar3[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                     lVar4 + -0x28));
          lVar4 = lVar4 + -0x22f0;
        } while (lVar4 != 0);
      }
      operator_delete__(&pTVar3[-1].fLastTerm,lVar6 * 0x22f0 | 8);
      (this->super_TPZVec<TPZEqnArray<float>_>).fStore = (TPZEqnArray<float> *)0x0;
      (this->super_TPZVec<TPZEqnArray<float>_>).fNAlloc = 0;
      lVar6 = 0;
    }
    if ((long)uVar7 < 0xb) {
      pTVar3 = (this->super_TPZVec<TPZEqnArray<float>_>).fStore;
      if (pTVar3 != (TPZEqnArray<float> *)0x0 && pTVar3 != (TPZEqnArray<float> *)&this->field_0x20)
      {
        lVar6 = *(long *)&pTVar3[-1].fLastTerm;
        if (lVar6 != 0) {
          lVar4 = lVar6 * 0x22f0;
          do {
            TPZEqnArray<float>::~TPZEqnArray
                      ((TPZEqnArray<float> *)
                       ((long)pTVar3[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                       lVar4 + -0x28));
            lVar4 = lVar4 + -0x22f0;
          } while (lVar4 != 0);
        }
        operator_delete__(&pTVar3[-1].fLastTerm,lVar6 * 0x22f0 | 8);
      }
      (this->super_TPZVec<TPZEqnArray<float>_>).fNAlloc = 0;
      (this->super_TPZVec<TPZEqnArray<float>_>).fStore = (TPZEqnArray<float> *)&this->field_0x20;
    }
    else if (lVar6 < (long)uVar7) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar7;
      uVar5 = 0xffffffffffffffff;
      if (SUB168(auVar1 * ZEXT816(0x22f0),8) == 0) {
        uVar5 = SUB168(auVar1 * ZEXT816(0x22f0),0) | 8;
      }
      puVar2 = (ulong *)operator_new__(uVar5);
      *puVar2 = uVar7;
      lVar6 = 0;
      pTVar3 = (TPZEqnArray<float> *)(puVar2 + 1);
      do {
        TPZEqnArray<float>::TPZEqnArray(pTVar3);
        lVar6 = lVar6 + -0x22f0;
        pTVar3 = pTVar3 + 1;
      } while (uVar7 * -0x22f0 - lVar6 != 0);
      (this->super_TPZVec<TPZEqnArray<float>_>).fStore = (TPZEqnArray<float> *)(puVar2 + 1);
      (this->super_TPZVec<TPZEqnArray<float>_>).fNAlloc = uVar7;
    }
    (this->super_TPZVec<TPZEqnArray<float>_>).fNElements = uVar7;
    uVar5 = 0;
    if ((long)uVar7 < 1) {
      uVar7 = uVar5;
    }
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      TPZEqnArray<float>::operator=
                ((TPZEqnArray<float> *)
                 ((long)(((this->super_TPZVec<TPZEqnArray<float>_>).fStore)->fEqStart).
                        super_TPZManVector<int,_100>.fExtAlloc + (uVar5 - 0x28)),
                 (TPZEqnArray<float> *)
                 ((long)(((copy->super_TPZVec<TPZEqnArray<float>_>).fStore)->fEqStart).
                        super_TPZManVector<int,_100>.fExtAlloc + (uVar5 - 0x28)));
      uVar5 = uVar5 + 0x22f0;
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}